

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::SpaceUsedExcludingSelfLong(Extension *this)

{
  CppType CVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  size_t local_18;
  size_t total_size;
  Extension *this_local;
  
  local_18 = 0;
  if ((this->is_repeated & 1U) == 0) {
    CVar1 = cpp_type(this->type);
    if (CVar1 == CPPTYPE_STRING) {
      local_18 = StringSpaceUsedExcludingSelfLong((this->field_0).string_value);
      local_18 = local_18 + 0x20;
    }
    else if (CVar1 == CPPTYPE_MESSAGE) {
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        pMVar3 = down_cast<google::protobuf::Message*,google::protobuf::MessageLite>
                           ((this->field_0).message_value);
        iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x14])();
        local_18 = CONCAT44(extraout_var,iVar2);
      }
      else {
        local_18 = (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase
                                ).arena_ + 0x58))();
      }
    }
  }
  else {
    CVar1 = cpp_type(this->type);
    switch(CVar1) {
    case CPPTYPE_INT32:
      local_18 = RepeatedField<int>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_int32_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_INT64:
      local_18 = RepeatedField<long>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_int64_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_UINT32:
      local_18 = RepeatedField<unsigned_int>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_uint32_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_UINT64:
      local_18 = RepeatedField<unsigned_long>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_uint64_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_DOUBLE:
      local_18 = RepeatedField<double>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_double_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_FLOAT:
      local_18 = RepeatedField<float>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_float_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_BOOL:
      local_18 = RepeatedField<bool>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_bool_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_ENUM:
      local_18 = RepeatedField<int>::SpaceUsedExcludingSelfLong
                           ((this->field_0).repeated_int32_value);
      local_18 = local_18 + 0x10;
      break;
    case CPPTYPE_STRING:
      local_18 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::SpaceUsedExcludingSelfLong((this->field_0).repeated_string_value);
      local_18 = local_18 + 0x18;
      break;
    case CPPTYPE_MESSAGE:
      local_18 = RepeatedMessage_SpaceUsedExcludingSelfLong
                           ((RepeatedPtrFieldBase *)(this->field_0).string_value);
      local_18 = local_18 + 0x18;
    }
  }
  return local_18;
}

Assistant:

size_t ExtensionSet::Extension::SpaceUsedExcludingSelfLong() const {
  size_t total_size = 0;
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                                  \
    total_size += sizeof(*repeated_##LOWERCASE##_value) +                     \
                  repeated_##LOWERCASE##_value->SpaceUsedExcludingSelfLong(); \
    break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_MESSAGE:
        // repeated_message_value is actually a RepeatedPtrField<MessageLite>,
        // but MessageLite has no SpaceUsedLong(), so we must directly call
        // RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() with a different
        // type handler.
        total_size +=
            sizeof(*repeated_message_value) +
            RepeatedMessage_SpaceUsedExcludingSelfLong(repeated_message_value);
        break;
    }
  } else {
    switch (cpp_type(type)) {
      case FieldDescriptor::CPPTYPE_STRING:
        total_size += sizeof(*string_value) +
                      StringSpaceUsedExcludingSelfLong(*string_value);
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (is_lazy) {
          total_size += lazymessage_value->SpaceUsedLong();
        } else {
          total_size += down_cast<Message*>(message_value)->SpaceUsedLong();
        }
        break;
      default:
        // No extra storage costs for primitive types.
        break;
    }
  }
  return total_size;
}